

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntUnionFind.cpp
# Opt level: O0

int __thiscall Lib::IntUnionFind::root(IntUnionFind *this,int c)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  size_t in_RDI;
  int prev;
  int in_stack_ffffffffffffffcc;
  Stack<int> *in_stack_ffffffffffffffd0;
  long lVar4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_c;
  
  if ((root(int)::path == '\0') && (iVar2 = __cxa_guard_acquire(&root(int)::path), iVar2 != 0)) {
    Stack<int>::Stack((Stack<int> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_RDI);
    __cxa_atexit(Stack<int>::~Stack,&root::path,&__dso_handle);
    __cxa_guard_release(&root(int)::path);
  }
  iVar2 = -1;
  local_c = in_ESI;
  while (*(int *)(*(long *)(in_RDI + 8) + (long)local_c * 4) != -1) {
    if (iVar2 != -1) {
      Stack<int>::push(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    }
    iVar2 = local_c;
    local_c = *(int *)(*(long *)(in_RDI + 8) + (long)local_c * 4);
  }
  while (bVar1 = Stack<int>::isNonEmpty(&root::path), bVar1) {
    lVar4 = *(long *)(in_RDI + 8);
    iVar2 = local_c;
    iVar3 = Stack<int>::pop(&root::path);
    *(int *)(lVar4 + (long)iVar3 * 4) = iVar2;
  }
  return local_c;
}

Assistant:

int IntUnionFind::root(int c) const
{
  static Stack<int> path(8);
  ASS(path.isEmpty());
  int prev=-1;

  while(_parents[c]!=-1) {
    if(prev!=-1) {
      path.push(prev);
    }
    prev=c;
    c=_parents[c];
  }

  while(path.isNonEmpty()) {
    _parents[path.pop()]=c;
  }
  return c;
}